

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O2

shared_ptr<Arms> __thiscall
cinject::InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_>::getInstance
          (InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_> *this,
          InjectionContext *context)

{
  pointer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<Arms> sVar2;
  undefined1 auStack_28 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if (*(char *)((long)&(context->componentStack_).
                       super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1) == '\0') {
    sVar2 = createInstance(this,context);
    _Var1 = sVar2.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    this_00 = &(context->componentStack_).
               super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if ((context->componentStack_).
        super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      createInstance((InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_> *)auStack_28,
                     context);
      std::__shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                 (__shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2> *)auStack_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_28 + 8));
    }
    std::__shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2> *)this_00);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Arms>)sVar2.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<TImplementation> getInstance(InjectionContext* context)
    {
        if (!isSingleton_)
        {
            return createInstance(context);
        }

        if (instance_ == nullptr)
        {
            instance_ = createInstance(context);
        }

        return instance_;
    }